

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O2

QVariant * __thiscall
QTableWidgetItem::data(QVariant *__return_storage_ptr__,QTableWidgetItem *this,int role)

{
  long lVar1;
  int iVar2;
  QVariant *pQVar3;
  
  iVar2 = 0;
  if (role != 2) {
    iVar2 = role;
  }
  pQVar3 = &((this->values).d.ptr)->value;
  lVar1 = (this->values).d.size * 0x28;
  while( true ) {
    if (lVar1 == 0) {
      *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
      (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
      *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
      *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = 2;
      return __return_storage_ptr__;
    }
    if (*(int *)((long)(pQVar3 + -1) + 0x18) == iVar2) break;
    pQVar3 = (QVariant *)((long)(pQVar3 + 1) + 8);
    lVar1 = lVar1 + -0x28;
  }
  ::QVariant::QVariant(__return_storage_ptr__,pQVar3);
  return __return_storage_ptr__;
}

Assistant:

QVariant QTableWidgetItem::data(int role) const
{
    role = (role == Qt::EditRole ? Qt::DisplayRole : role);
    for (const auto &value : values) {
        if (value.role == role)
            return value.value;
    }
    return QVariant();
}